

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentfragment.cpp
# Opt level: O2

QTextDocumentFragment __thiscall
QTextDocumentFragment::fromPlainText(QTextDocumentFragment *this,QString *plainText)

{
  undefined1 *puVar1;
  long lVar2;
  QTextDocumentFragmentPrivate *this_00;
  long in_FS_OFFSET;
  QTextCursor cursor;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this->d = (QTextDocumentFragmentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QTextDocumentFragment(this);
  this_00 = (QTextDocumentFragmentPrivate *)operator_new(0x18);
  QTextCursor::QTextCursor(&cursor);
  QTextDocumentFragmentPrivate::QTextDocumentFragmentPrivate(this_00,&cursor);
  this->d = this_00;
  QTextCursor::~QTextCursor(&cursor);
  puVar1 = &this->d->field_0x10;
  *puVar1 = *puVar1 | 1;
  cursor.d.d.ptr = (QSharedDataPointer<QTextCursorPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::QTextCursor(&cursor,this->d->doc);
  QTextCursor::insertText(&cursor,plainText);
  QTextCursor::~QTextCursor(&cursor);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (QTextDocumentFragment)(QTextDocumentFragmentPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QTextDocumentFragment QTextDocumentFragment::fromPlainText(const QString &plainText)
{
    QTextDocumentFragment res;

    res.d = new QTextDocumentFragmentPrivate;
    res.d->importedFromPlainText = true;
    QTextCursor cursor(res.d->doc);
    cursor.insertText(plainText);
    return res;
}